

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdPrint2_rec(FILE *pFile,Kit_DsdNtk_t *pNtk,int Id)

{
  ushort uVar1;
  int iVar2;
  Kit_DsdObj_t *pKVar3;
  char local_31;
  uint local_30;
  char Symbol;
  uint i;
  uint iLit;
  Kit_DsdObj_t *pObj;
  int Id_local;
  Kit_DsdNtk_t *pNtk_local;
  FILE *pFile_local;
  
  pKVar3 = Kit_DsdNtkObj(pNtk,Id);
  if (pKVar3 == (Kit_DsdObj_t *)0x0) {
    if ((int)(uint)pNtk->nVars <= Id) {
      __assert_fail("Id < pNtk->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0xf7,"void Kit_DsdPrint2_rec(FILE *, Kit_DsdNtk_t *, int)");
    }
    fprintf((FILE *)pFile,"%c",(ulong)(Id + 0x61));
  }
  else if (((uint)*pKVar3 >> 6 & 7) == 1) {
    if ((uint)*pKVar3 >> 0x1a != 0) {
      __assert_fail("pObj->nFans == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0xfe,"void Kit_DsdPrint2_rec(FILE *, Kit_DsdNtk_t *, int)");
    }
    fprintf((FILE *)pFile,"Const1");
  }
  else {
    if ((((uint)*pKVar3 >> 6 & 7) == 2) && ((uint)*pKVar3 >> 0x1a != 1)) {
      __assert_fail("pObj->nFans == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x104,"void Kit_DsdPrint2_rec(FILE *, Kit_DsdNtk_t *, int)");
    }
    if (((uint)*pKVar3 >> 6 & 7) == 3) {
      local_31 = '*';
    }
    else if (((uint)*pKVar3 >> 6 & 7) == 4) {
      local_31 = '+';
    }
    else {
      local_31 = ',';
    }
    if (((uint)*pKVar3 >> 6 & 7) == 5) {
      fprintf((FILE *)pFile,"[");
    }
    else {
      fprintf((FILE *)pFile,"(");
    }
    for (local_30 = 0; local_30 < (uint)*pKVar3 >> 0x1a; local_30 = local_30 + 1) {
      uVar1 = *(ushort *)(&pKVar3[1].field_0x0 + (ulong)local_30 * 2);
      iVar2 = Abc_LitIsCompl((uint)uVar1);
      if (iVar2 != 0) {
        fprintf((FILE *)pFile,"!");
      }
      iVar2 = Abc_Lit2Var((uint)uVar1);
      Kit_DsdPrint2_rec(pFile,pNtk,iVar2);
      if (local_30 < ((uint)*pKVar3 >> 0x1a) - 1) {
        fprintf((FILE *)pFile,"%c",(ulong)(uint)(int)local_31);
      }
    }
    if (((uint)*pKVar3 >> 6 & 7) == 5) {
      fprintf((FILE *)pFile,"]");
    }
    else {
      fprintf((FILE *)pFile,")");
    }
  }
  return;
}

Assistant:

void Kit_DsdPrint2_rec( FILE * pFile, Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i;
    char Symbol;

    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        fprintf( pFile, "%c", 'a' + Id );
        return;
    }

    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        fprintf( pFile, "Const1" );
        return;
    }

    if ( pObj->Type == KIT_DSD_VAR )
        assert( pObj->nFans == 1 );

    if ( pObj->Type == KIT_DSD_AND )
        Symbol = '*';
    else if ( pObj->Type == KIT_DSD_XOR )
        Symbol = '+';
    else 
        Symbol = ',';

    if ( pObj->Type == KIT_DSD_PRIME )
        fprintf( pFile, "[" );
    else
        fprintf( pFile, "(" );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
    {
        if ( Abc_LitIsCompl(iLit) ) 
            fprintf( pFile, "!" );
        Kit_DsdPrint2_rec( pFile, pNtk, Abc_Lit2Var(iLit) );
        if ( i < pObj->nFans - 1 )
            fprintf( pFile, "%c", Symbol );
    }
    if ( pObj->Type == KIT_DSD_PRIME )
        fprintf( pFile, "]" );
    else
        fprintf( pFile, ")" );
}